

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string s;
  Blockchain A;
  char local_b9;
  string local_b8;
  Blockchain local_98;
  Block local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,*argv,(allocator<char> *)&local_98);
  Blockchain::Blockchain(&local_98);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"New block added",0xf);
  local_b9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_b9,1);
  Block::Block(&local_78,1,&local_b8);
  Blockchain::addBlock(&local_98,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.newHash._M_dataplus._M_p != &local_78.newHash.field_2) {
    operator_delete(local_78.newHash._M_dataplus._M_p,
                    local_78.newHash.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.data._M_dataplus._M_p != &local_78.data.field_2) {
    operator_delete(local_78.data._M_dataplus._M_p,local_78.data.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.previousHash._M_dataplus._M_p != &local_78.previousHash.field_2) {
    operator_delete(local_78.previousHash._M_dataplus._M_p,
                    local_78.previousHash.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::_List_base<Block,_std::allocator<Block>_>::_M_clear
            (&local_98.offChain.super__List_base<Block,_std::allocator<Block>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    string s = argv[0];
    Blockchain A = Blockchain();
    std::cout << "New block added"<<'\n';
    A.addBlock(Block(1,s));
    return 0;
}